

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_state_machine_cache.cpp
# Opt level: O2

void __thiscall duckdb::CSVStateMachineCache::CSVStateMachineCache(CSVStateMachineCache *this)

{
  bool strict_mode_p;
  reference pvVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  pointer pbVar5;
  char *pcVar6;
  undefined2 local_19a;
  CSVStateMachineCache *local_198;
  char *local_190;
  char *local_188;
  pointer local_180;
  pointer local_178;
  ulong local_170;
  pointer local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  long local_148;
  vector<char,_true> default_comment;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  default_delimiter;
  vector<duckdb::QuoteRule,_true> default_quote_rule;
  vector<duckdb::vector<char,_true>,_true> default_quote;
  vector<duckdb::vector<char,_true>,_true> default_escape;
  undefined1 local_c8 [56];
  string local_90;
  string local_70;
  string local_50;
  
  (this->super_ObjectCacheEntry)._vptr_ObjectCacheEntry =
       (_func_int **)&PTR__CSVStateMachineCache_027b6348;
  (this->state_machine_cache)._M_h._M_buckets = &(this->state_machine_cache)._M_h._M_single_bucket;
  (this->state_machine_cache)._M_h._M_bucket_count = 1;
  (this->state_machine_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->state_machine_cache)._M_h._M_element_count = 0;
  (this->state_machine_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->state_machine_cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->state_machine_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->main_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->main_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->main_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->main_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->main_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_198 = this;
  DialectCandidates::GetDefaultQuote();
  DialectCandidates::GetDefaultEscape();
  DialectCandidates::GetDefaultQuoteRule();
  DialectCandidates::GetDefaultDelimiter_abi_cxx11_();
  DialectCandidates::GetDefaultComment();
  local_180 = default_quote_rule.super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>
              .super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
              super__Vector_impl_data._M_finish;
  while (default_quote_rule.super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
         super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
         super__Vector_impl_data._M_start != local_180) {
    local_170 = (ulong)*default_quote_rule.
                        super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                        super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    local_178 = default_quote_rule.
                super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
                super__Vector_impl_data._M_start;
    pvVar1 = vector<duckdb::vector<char,_true>,_true>::get<true>(&default_quote,local_170);
    pcVar3 = (pvVar1->super_vector<char,_std::allocator<char>_>).
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    local_150 = pcVar3;
    for (pcVar4 = (pvVar1->super_vector<char,_std::allocator<char>_>).
                  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_start; pcVar4 != pcVar3; pcVar4 = pcVar4 + 1) {
      local_168 = default_delimiter.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar5 = default_delimiter.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != local_168;
          pbVar5 = pbVar5 + 1) {
        pvVar1 = vector<duckdb::vector<char,_true>,_true>::get<true>(&default_escape,local_170);
        pcVar6 = (pvVar1->super_vector<char,_std::allocator<char>_>).
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        local_160 = (pvVar1->super_vector<char,_std::allocator<char>_>).
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_finish;
        for (; pcVar6 != local_160; pcVar6 = pcVar6 + 1) {
          local_158 = default_comment.super_vector<char,_std::allocator<char>_>.
                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          local_188 = pcVar6;
          for (local_190 = default_comment.super_vector<char,_std::allocator<char>_>.
                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start; local_190 != local_158;
              local_190 = local_190 + 1) {
            local_19a = 1;
            lVar2 = 0;
            while (lVar2 != 2) {
              local_148 = lVar2;
              strict_mode_p = *(bool *)((long)&local_19a + lVar2);
              ::std::__cxx11::string::string((string *)&local_90,(string *)pbVar5);
              CSVStateMachineOptions::CSVStateMachineOptions
                        ((CSVStateMachineOptions *)local_c8,&local_90,*pcVar4,*local_188,*local_190,
                         SINGLE_N,strict_mode_p);
              Insert(local_198,(CSVStateMachineOptions *)local_c8);
              ::std::__cxx11::string::~string((string *)(local_c8 + 8));
              ::std::__cxx11::string::~string((string *)&local_90);
              ::std::__cxx11::string::string((string *)&local_50,(string *)pbVar5);
              CSVStateMachineOptions::CSVStateMachineOptions
                        ((CSVStateMachineOptions *)local_c8,&local_50,*pcVar4,*local_188,*local_190,
                         SINGLE_R,strict_mode_p);
              Insert(local_198,(CSVStateMachineOptions *)local_c8);
              ::std::__cxx11::string::~string((string *)(local_c8 + 8));
              ::std::__cxx11::string::~string((string *)&local_50);
              ::std::__cxx11::string::string((string *)&local_70,(string *)pbVar5);
              pcVar6 = local_188;
              CSVStateMachineOptions::CSVStateMachineOptions
                        ((CSVStateMachineOptions *)local_c8,&local_70,*pcVar4,*local_188,*local_190,
                         CARRY_ON,strict_mode_p);
              Insert(local_198,(CSVStateMachineOptions *)local_c8);
              ::std::__cxx11::string::~string((string *)(local_c8 + 8));
              ::std::__cxx11::string::~string((string *)&local_70);
              pcVar3 = local_150;
              lVar2 = local_148 + 1;
            }
          }
        }
      }
    }
    default_quote_rule.super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
    super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
    super__Vector_impl_data._M_start = local_178 + 1;
  }
  ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&default_comment);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&default_delimiter);
  ::std::_Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>::~_Vector_base
            ((_Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_> *)
             &default_quote_rule);
  ::std::vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_>::~vector
            (&default_escape.
              super_vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_>
            );
  ::std::vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_>::~vector
            (&default_quote.
              super_vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_>
            );
  return;
}

Assistant:

CSVStateMachineCache::CSVStateMachineCache() {
	auto default_quote = DialectCandidates::GetDefaultQuote();
	auto default_escape = DialectCandidates::GetDefaultEscape();
	auto default_quote_rule = DialectCandidates::GetDefaultQuoteRule();
	auto default_delimiter = DialectCandidates::GetDefaultDelimiter();
	auto default_comment = DialectCandidates::GetDefaultComment();

	for (auto quote_rule : default_quote_rule) {
		const auto &quote_candidates = default_quote[static_cast<uint8_t>(quote_rule)];
		for (const auto &quote : quote_candidates) {
			for (const auto &delimiter : default_delimiter) {
				const auto &escape_candidates = default_escape[static_cast<uint8_t>(quote_rule)];
				for (const auto &escape : escape_candidates) {
					for (const auto &comment : default_comment) {
						for (const bool strict_mode : {true, false}) {
							Insert({delimiter, quote, escape, comment, NewLineIdentifier::SINGLE_N, strict_mode});
							Insert({delimiter, quote, escape, comment, NewLineIdentifier::SINGLE_R, strict_mode});
							Insert({delimiter, quote, escape, comment, NewLineIdentifier::CARRY_ON, strict_mode});
						}
					}
				}
			}
		}
	}
}